

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

void __thiscall
glcts::StateInteractionCase::generateVarLinkFragmentShaderSrc
          (StateInteractionCase *this,string *outFragSrc,GLSLVersion glslVersion,int numInputs)

{
  char *pcVar1;
  ostream *poVar2;
  string local_1c8 [48];
  undefined1 local_198 [8];
  ostringstream fragSrc;
  int numInputs_local;
  GLSLVersion glslVersion_local;
  string *outFragSrc_local;
  StateInteractionCase *this_local;
  
  fragSrc._368_4_ = numInputs;
  fragSrc._372_4_ = glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  pcVar1 = glu::getGLSLVersionDeclaration(fragSrc._372_4_);
  poVar2 = std::operator<<((ostream *)local_198,pcVar1);
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)local_198,"precision highp float;\n");
  std::operator<<((ostream *)local_198,"precision highp int;\n");
  switch(fragSrc._368_4_) {
  case (BADTYPE)0x5:
    std::operator<<((ostream *)local_198,"layout(location = 3) in vec4 i_val5;\n");
  case (BADTYPE)0x4:
    std::operator<<((ostream *)local_198,"flat in uvec4 val4;\n");
  case (BADTYPE)0x3:
    std::operator<<((ostream *)local_198,"flat in ivec2 val3;\n");
  case (BADTYPE)0x2:
    std::operator<<((ostream *)local_198,"in vec3 val2[2];\n");
  case (BADTYPE)0x1:
    std::operator<<((ostream *)local_198,"in vec4 val1;\n");
  default:
    std::operator<<((ostream *)local_198,"in float val0;\n");
    std::operator<<((ostream *)local_198,"layout(location = 0) out mediump vec4 o_color;\n");
    std::operator<<((ostream *)local_198,"void main (void)\n");
    std::operator<<((ostream *)local_198,"{\n");
    switch(fragSrc._368_4_) {
    case (BADTYPE)0x1:
      std::operator<<((ostream *)local_198,"    o_color = vec4(val1);\n");
      break;
    case (BADTYPE)0x2:
      std::operator<<((ostream *)local_198,"    o_color = vec4(val2[0], 1.0);\n");
      break;
    case (BADTYPE)0x3:
      std::operator<<((ostream *)local_198,"    o_color = vec4(val3, 1.0, 1.0);\n");
      break;
    case (BADTYPE)0x4:
      std::operator<<((ostream *)local_198,"    o_color = vec4(val4);\n");
      break;
    case (BADTYPE)0x5:
      std::operator<<((ostream *)local_198,"    o_color = i_val5;\n");
      break;
    default:
      std::operator<<((ostream *)local_198,"    o_color = vec4(val0, val0, val0, 1.0);\n");
    }
    std::operator<<((ostream *)local_198,"}\n");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)outFragSrc,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    return;
  }
}

Assistant:

void generateVarLinkFragmentShaderSrc(std::string& outFragSrc, glu::GLSLVersion glslVersion, int numInputs)
	{
		std::ostringstream fragSrc;

		fragSrc << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
		fragSrc << "precision highp float;\n";
		fragSrc << "precision highp int;\n";

		switch (numInputs)
		{
		// Note all these cases fall through
		case 5:
			fragSrc << "layout(location = 3) in vec4 i_val5;\n";
		case 4:
			fragSrc << "flat in uvec4 val4;\n";
		case 3:
			fragSrc << "flat in ivec2 val3;\n";
		case 2:
			fragSrc << "in vec3 val2[2];\n";
		case 1:
			fragSrc << "in vec4 val1;\n";
		default:
			fragSrc << "in float val0;\n";
		}

		fragSrc << "layout(location = 0) out mediump vec4 o_color;\n";
		fragSrc << "void main (void)\n";
		fragSrc << "{\n";

		switch (numInputs)
		{
		case 5:
			fragSrc << "    o_color = i_val5;\n";
			break;
		case 4:
			fragSrc << "    o_color = vec4(val4);\n";
			break;
		case 3:
			fragSrc << "    o_color = vec4(val3, 1.0, 1.0);\n";
			break;
		case 2:
			fragSrc << "    o_color = vec4(val2[0], 1.0);\n";
			break;
		case 1:
			fragSrc << "    o_color = vec4(val1);\n";
			break;
		default:
			fragSrc << "    o_color = vec4(val0, val0, val0, 1.0);\n";
			break;
		}

		fragSrc << "}\n";

		outFragSrc = fragSrc.str();
	}